

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_set_row_mt(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  uint *puVar3;
  av1_extracfg extra_cfg;
  av1_extracfg local_270;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar3 + 2;
  }
  uVar1 = *puVar3;
  aVar2 = AOM_CODEC_OK;
  if (uVar1 != (ctx->extra_cfg).row_mt) {
    memcpy(&local_270,&ctx->extra_cfg,600);
    local_270.row_mt = uVar1;
    aVar2 = update_extra_cfg(ctx,&local_270);
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_row_mt(aom_codec_alg_priv_t *ctx,
                                       va_list args) {
  unsigned int row_mt = CAST(AV1E_SET_ROW_MT, args);
  if (row_mt == ctx->extra_cfg.row_mt) return AOM_CODEC_OK;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.row_mt = row_mt;
  return update_extra_cfg(ctx, &extra_cfg);
}